

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

int Cec3_ManSolveTwo(Cec3_Man_t *p,int iObj0,int iObj1,int fPhase)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong in_RAX;
  uint uVar10;
  long lVar11;
  long lVar12;
  int Lits [2];
  undefined8 local_38;
  
  iVar9 = iObj0;
  if (iObj0 < iObj1) {
    iVar9 = iObj1;
  }
  if (iObj1 < iObj0) {
    iObj0 = iObj1;
  }
  if (iVar9 <= iObj0) {
    __assert_fail("iObj0 < iObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32d,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  local_38 = in_RAX;
  if ((p->pPars->fUseCones == 0) && (iVar7 = bmcg_sat_solver_varnum(p->pSat), iVar7 != 0)) {
    __assert_fail("p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32e,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  if (iObj0 == 0) {
    pGVar1 = p->pNew;
    if (pGVar1->nObjs < 1) {
LAB_0065ceb7:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if ((pGVar1->vCopies2).nSize < 1) {
LAB_0065ce3b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (*(pGVar1->vCopies2).pArray == -1) {
      pGVar2 = pGVar1->pObjs;
      iVar7 = bmcg_sat_solver_addvar(p->pSat);
      pGVar3 = pGVar1->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + pGVar1->nObjs <= pGVar2)) goto LAB_0065ceb7;
      uVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
      if (((int)uVar10 < 0) || ((pGVar1->vCopies2).nSize <= (int)uVar10)) goto LAB_0065ce3b;
      piVar4 = (pGVar1->vCopies2).pArray;
      if (piVar4[uVar10 & 0x7fffffff] != -1) {
        __assert_fail("Cec3_ObjSatId(p, pObj) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                      ,0x4d,"int Cec3_ObjSetSatId(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      piVar4[uVar10 & 0x7fffffff] = iVar7;
    }
  }
  iVar7 = Cec3_ObjGetCnfVar(p,iObj0);
  iVar8 = Cec3_ObjGetCnfVar(p,iVar9);
  p->vNodesNew->nSize = 0;
  p->vSatVars->nSize = 0;
  p->vObjSatPairs->nSize = 0;
  Gia_ManIncrementTravId(p->pNew);
  Cec3_ManCollect_rec(p,iObj0);
  Cec3_ManCollect_rec(p,iVar9);
  if (-1 < iVar7) {
    iVar9 = iVar7 * 2 + 1;
    local_38 = CONCAT44(local_38._4_4_,iVar9);
    if (((uint)fPhase < 2) && (-1 < iVar8)) {
      iVar8 = fPhase + iVar8 * 2;
      local_38 = CONCAT44(iVar8,iVar9);
      bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
      iVar9 = bmcg_sat_solver_solve(p->pSat,(int *)&local_38,2);
      if (0 < iObj0 && iVar9 == -1) {
        local_38 = CONCAT44(iVar8,iVar7 * 2) ^ 0x100000000;
        bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
        iVar9 = bmcg_sat_solver_solve(p->pSat,(int *)&local_38,2);
      }
      if ((p->pPars->fUseCones == 0) && (pVVar5 = p->vNodesNew, 0 < pVVar5->nSize)) {
        pGVar1 = p->pNew;
        piVar4 = pVVar5->pArray;
        lVar11 = 0;
        do {
          iVar7 = piVar4[lVar11];
          lVar12 = (long)iVar7;
          if ((lVar12 < 0) || (pGVar1->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar1->pObjs == (Gia_Obj_t *)0x0) {
            return iVar9;
          }
          if ((pGVar1->vCopies2).nSize <= iVar7) goto LAB_0065ce3b;
          piVar6 = (pGVar1->vCopies2).pArray;
          if (piVar6[lVar12] == -1) {
            __assert_fail("Cec3_ObjSatId(p, pObj) != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                          ,0x4e,"void Cec3_ObjCleanSatId(Gia_Man_t *, Gia_Obj_t *)");
          }
          piVar6[lVar12] = -1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar5->nSize);
      }
      return iVar9;
    }
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Cec3_ManSolveTwo( Cec3_Man_t * p, int iObj0, int iObj1, int fPhase )
{
    Gia_Obj_t * pObj;
    int status, i, iVar0, iVar1, Lits[2];
    if (iObj1 < iObj0) 
        iObj1 ^= iObj0, iObj0 ^= iObj1, iObj1 ^= iObj0;
    assert( iObj0 < iObj1 );
    assert( p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0 );
    if ( !iObj0 && Cec3_ObjSatId(p->pNew, Gia_ManConst0(p->pNew)) == -1 )
        Cec3_ObjSetSatId( p->pNew, Gia_ManConst0(p->pNew), bmcg_sat_solver_addvar(p->pSat) );
    iVar0 = Cec3_ObjGetCnfVar( p, iObj0 );
    iVar1 = Cec3_ObjGetCnfVar( p, iObj1 );
    // collect inputs and internal nodes
    Vec_IntClear( p->vNodesNew );
    Vec_IntClear( p->vSatVars );
    Vec_IntClear( p->vObjSatPairs );
    Gia_ManIncrementTravId( p->pNew );
    Cec3_ManCollect_rec( p, iObj0 );
    Cec3_ManCollect_rec( p, iObj1 );
//printf( "%d ", Vec_IntSize(p->vNodesNew) );
    // solve direct
    if ( p->pPars->fUseCones )  satoko_mark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 1) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, fPhase) );
//    status = satoko_solve( p->pSat );
//    satoko_assump_pop( p->pSat );
//    satoko_assump_pop( p->pSat );
    Lits[0] = Abc_Var2Lit(iVar0, 1);
    Lits[1] = Abc_Var2Lit(iVar1, fPhase);
    bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
    status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    if ( status == GLUCOSE_UNSAT && iObj0 > 0 )
    {
        // solve reverse
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 0) );
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, !fPhase) );
//        status = satoko_solve( p->pSat );
//        satoko_assump_pop( p->pSat );
//        satoko_assump_pop( p->pSat );
        Lits[0] = Abc_Var2Lit(iVar0, 0);
        Lits[1] = Abc_Var2Lit(iVar1, !fPhase);
        bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
        status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    }
    if ( p->pPars->fUseCones )  satoko_unmark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
    //if ( status == SATOKO_SAT )
    //    Cec3_ManVerify( p->pNew, iObj0, iObj1, fPhase, p->pSat );
    if ( p->pPars->fUseCones )
        return status;
    Gia_ManForEachObjVec( p->vNodesNew, p->pNew, pObj, i )
        Cec3_ObjCleanSatId( p->pNew, pObj );
    return status;
}